

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional_suite.cpp
# Opt level: O0

void from_suite::convert_boolean(void)

{
  bool v;
  optional<bool> *u;
  undefined1 local_57;
  undefined1 local_56 [14];
  undefined1 local_48 [8];
  variable result;
  bool local_b;
  convert local_a [8];
  optional<bool> value;
  
  local_b = true;
  boost::optional<bool>::optional((optional<bool> *)local_a,&local_b);
  trial::dynamic::convert::
  into<trial::dynamic::basic_variable<std::allocator<char>>,boost::optional<bool>>
            ((basic_variable<std::allocator<char>_> *)local_48,local_a,u);
  v = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                ((basic_variable<std::allocator<char>_> *)local_48);
  boost::detail::test_impl
            ("result.is<bool>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/optional_suite.cpp"
             ,0x22,"void from_suite::convert_boolean()",v);
  local_56[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<bool>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_57 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("result.value<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/optional_suite.cpp"
             ,0x23,"void from_suite::convert_boolean()",local_56,&local_57);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_48);
  return;
}

Assistant:

void convert_boolean()
{
    boost::optional<bool> value = true;
    variable result = convert::into<variable>(value);
    TRIAL_PROTOCOL_TEST(result.is<bool>());
    TRIAL_PROTOCOL_TEST_EQUAL(result.value<bool>(), true);
}